

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

scalar __thiscall
absl::
make_unique<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,int&,S2Builder::GraphOptions_const&,std::shared_ptr<s2builderutil::NormalizeClosedSetImpl>&>
          (absl *this,int *args,GraphOptions *args_1,
          shared_ptr<s2builderutil::NormalizeClosedSetImpl> *args_2)

{
  int iVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 *puVar4;
  __shared_ptr<s2builderutil::NormalizeClosedSetImpl,_(__gnu_cxx::_Lock_policy)2> local_48;
  
  puVar4 = (undefined8 *)operator_new(0x30);
  iVar1 = *args;
  std::__shared_ptr<s2builderutil::NormalizeClosedSetImpl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,
             &args_2->
              super___shared_ptr<s2builderutil::NormalizeClosedSetImpl,_(__gnu_cxx::_Lock_policy)2>)
  ;
  _Var3._M_pi = local_48._M_refcount._M_pi;
  *puVar4 = &PTR__DimensionLayer_003043e0;
  *(int *)(puVar4 + 1) = iVar1;
  uVar2 = *(undefined8 *)&args_1->duplicate_edges_;
  *(undefined8 *)((long)puVar4 + 0xc) = *(undefined8 *)args_1;
  *(undefined8 *)((long)puVar4 + 0x14) = uVar2;
  *(undefined4 *)((long)puVar4 + 0x1c) = *(undefined4 *)&args_1->allow_vertex_filtering_;
  local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar4[4] = local_48._M_ptr;
  puVar4[5] = _Var3._M_pi;
  local_48._M_ptr = (element_type *)0x0;
  *(undefined8 **)this = puVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  return (__uniq_ptr_data<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,_std::default_delete<s2builderutil::NormalizeClosedSetImpl::DimensionLayer>,_true,_true>
          )(__uniq_ptr_data<s2builderutil::NormalizeClosedSetImpl::DimensionLayer,_std::default_delete<s2builderutil::NormalizeClosedSetImpl::DimensionLayer>,_true,_true>
            )this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}